

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.hpp
# Opt level: O0

void __thiscall deqp::gls::LineStream::~LineStream(LineStream *this)

{
  LineStream *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_string);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stream);
  return;
}

Assistant:

~LineStream		(void)				{}